

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLEScanPartialInternal<long,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  RLEScanState<long> *this;
  Vector *pVVar4;
  idx_t iVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t in_RDX;
  ColumnSegment *in_RDI;
  ulong in_R8;
  idx_t i_1;
  idx_t i;
  long element;
  idx_t remaining_scan_count;
  idx_t run_count;
  rle_count_t run_end;
  idx_t result_end;
  long *result_data;
  rle_count_t *index_pointer;
  long *data_pointer;
  data_ptr_t data;
  RLEScanState<long> *scan_state;
  SegmentScanState *in_stack_ffffffffffffff70;
  Vector *result_00;
  idx_t in_stack_ffffffffffffff78;
  long *in_stack_ffffffffffffff80;
  rle_count_t *in_stack_ffffffffffffff88;
  RLEScanState<long> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  VectorType vector_type_p;
  undefined6 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa6;
  ulong local_28;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_ffffffffffffff70);
  this = SegmentScanState::Cast<duckdb::RLEScanState<long>>(in_stack_ffffffffffffff70);
  pVVar4 = (Vector *)BufferHandle::Ptr((BufferHandle *)0xa50be5);
  iVar5 = ColumnSegment::GetBlockOffset(in_RDI);
  lVar2 = this->rle_count_offset + iVar5;
  result_00 = pVVar4;
  bVar3 = CanEmitConstantVector<true>
                    (this->position_in_entry,
                     (ulong)*(ushort *)(&pVVar4->vector_type + this->entry_pos * 2 + lVar2),in_RDX);
  if (bVar3) {
    RLEScanConstant<long>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,result_00);
  }
  else {
    plVar6 = FlatVector::GetData<long>((Vector *)0xa50c8a);
    Vector::SetVectorType
              ((Vector *)CONCAT26(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0),vector_type_p
              );
    local_28 = in_R8;
    while (local_28 < in_R8 + in_RDX) {
      uVar7 = (ulong)*(ushort *)(&pVVar4->vector_type + this->entry_pos * 2 + lVar2) -
              this->position_in_entry;
      uVar8 = (in_R8 + in_RDX) - local_28;
      lVar1 = *(long *)(&(pVVar4->type).id_ + this->entry_pos * 8 + iVar5);
      if (uVar8 < uVar7) {
        for (uVar7 = 0; uVar7 < uVar8; uVar7 = uVar7 + 1) {
          plVar6[local_28 + uVar7] = lVar1;
        }
        this->position_in_entry = uVar8 + this->position_in_entry;
        return;
      }
      for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
        plVar6[local_28 + uVar8] = lVar1;
      }
      local_28 = uVar7 + local_28;
      RLEScanState<long>::ForwardToNextRun(this);
    }
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}